

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_soc.cpp
# Opt level: O3

MppDecHwCap * mpp_get_dec_hw_info_by_client_type(MppClientType client_type)

{
  MppDecHwCap *pMVar1;
  MppSocService *pMVar2;
  long lVar3;
  
  if (mpp_get_soc_info::soc_info == (MppSocInfo *)0x0) {
    pMVar2 = MppSocService::get();
    mpp_get_soc_info::soc_info = pMVar2->soc_info;
  }
  lVar3 = 2;
  while ((pMVar1 = mpp_get_soc_info::soc_info->dec_caps[lVar3 + -2], pMVar1 == (MppDecHwCap *)0x0 ||
         ((byte)pMVar1->field_0x4 != client_type))) {
    lVar3 = lVar3 + 1;
    if (lVar3 == 8) {
      return (MppDecHwCap *)0x0;
    }
  }
  return pMVar1;
}

Assistant:

const MppDecHwCap* mpp_get_dec_hw_info_by_client_type(MppClientType client_type)
{
    const MppDecHwCap* hw_info = NULL;
    const MppSocInfo *info = mpp_get_soc_info();
    RK_U32 i = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(info->dec_caps); i++) {
        if (info->dec_caps[i] && info->dec_caps[i]->type == client_type) {
            hw_info = info->dec_caps[i];
            break;
        }
    }

    return hw_info;
}